

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

Node * __thiscall
czh::node::Node::add<czh::value::Value&,void>
          (Node *this,string *add_name,Value *_value,string *before,Token *token,source_location *l)

{
  variant_alternative_t<0UL,_variant<NodeData,_Value>_> *this_00;
  Node *pNVar1;
  int err;
  int local_19c;
  source_location *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_170;
  Token local_148;
  Node local_f8;
  
  local_198 = l;
  assert_node(this,l);
  this_00 = std::get<0ul,czh::node::Node::NodeData,czh::value::Value>(&this->data);
  local_19c = 0;
  std::__cxx11::string::string(&local_190,add_name);
  std::__detail::__variant::
  _Copy_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&local_170,
                    (_Copy_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)_value);
  czh::token::Token::Token(&local_148,token);
  Node(&local_f8,this,&local_190,(Value *)&local_170,&local_148);
  pNVar1 = NodeData::add(this_00,&local_f8,before,&local_19c);
  ~Node(&local_f8);
  czh::token::Token::~Token(&local_148);
  std::__detail::__variant::
  _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Variant_storage(&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  if (local_19c != 0) {
    report_no_node(this,before,local_198);
  }
  return pNVar1;
}

Assistant:

Node &add(std::string add_name, T &&_value, const std::string &before = "", token::Token token = token::Token(),
              const std::source_location &l =
              std::source_location::current())
    {
      assert_node(l);
      auto &nd = std::get<NodeData>(data);
      int err = 0;
      auto ret = nd.add(Node(this, std::move(add_name), Value(std::forward<T>(_value)), std::move(token)), before,
                        err);
      if (err != 0) report_no_node(before, l);
      return *ret;
    }